

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::base::UnixSocketRaw::SetBlocking(UnixSocketRaw *this,bool is_blocking)

{
  uint uVar1;
  code *pcVar2;
  int iVar3;
  char *fname;
  uint *puVar4;
  int *piVar5;
  char *pcVar6;
  uint local_18;
  int fcntl_res;
  int flags;
  bool is_blocking_local;
  UnixSocketRaw *this_local;
  
  iVar3 = ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
          ::operator*(&this->fd_);
  local_18 = fcntl(iVar3,3,0);
  if (is_blocking) {
    local_18 = local_18 & 0xfffff7ff;
  }
  else {
    local_18 = local_18 | 0x800;
  }
  iVar3 = ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
          ::operator*(&this->fd_);
  iVar3 = fcntl(iVar3,4,(ulong)local_18);
  if (iVar3 == 0) {
    return;
  }
  fname = Basename(
                  "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                  );
  puVar4 = (uint *)__errno_location();
  uVar1 = *puVar4;
  piVar5 = __errno_location();
  pcVar6 = strerror(*piVar5);
  LogMessage(kLogError,fname,0x10787,"%s (errno: %d, %s)","PERFETTO_CHECK(fcntl_res == 0)",
             (ulong)uVar1,pcVar6);
  MaybeSerializeLastLogsForCrashReporting();
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void UnixSocketRaw::SetBlocking(bool is_blocking) {
  PERFETTO_DCHECK(fd_);
#if PERFETTO_BUILDFLAG(PERFETTO_OS_WIN)
  unsigned long flag = is_blocking ? 0 : 1;  // FIONBIO has reverse logic.
  if (is_blocking) {
    // When switching between non-blocking -> blocking mode, we need to reset
    // the event handle registration, otherwise the call will fail.
    PERFETTO_CHECK(WSAEventSelect(*fd_, *event_handle_, 0) == 0);
  }
  PERFETTO_CHECK(ioctlsocket(*fd_, static_cast<long>(FIONBIO), &flag) == 0);
  if (!is_blocking) {
    PERFETTO_CHECK(
        WSAEventSelect(*fd_, *event_handle_,
                       FD_ACCEPT | FD_CONNECT | FD_READ | FD_CLOSE) == 0);
  }
#else
  int flags = fcntl(*fd_, F_GETFL, 0);
  if (!is_blocking) {
    flags |= O_NONBLOCK;
  } else {
    flags &= ~static_cast<int>(O_NONBLOCK);
  }
  int fcntl_res = fcntl(*fd_, F_SETFL, flags);
  PERFETTO_CHECK(fcntl_res == 0);
#endif
}